

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmcBmcAnd.c
# Opt level: O2

void Bmc_MnaCollect(Gia_Man_t *p,Vec_Int_t *vCos,Vec_Int_t *vNodes,uint *pState)

{
  int v;
  uint uVar1;
  Gia_Obj_t *pGVar2;
  uint uVar3;
  int i;
  
  vNodes->nSize = 0;
  *(ulong *)p->pObjs = *(ulong *)p->pObjs | 0x8000000000000000;
  p->pObjs->Value = 1;
  i = 0;
  do {
    if (vCos->nSize <= i) {
      return;
    }
    v = Vec_IntEntry(vCos,i);
    pGVar2 = Gia_ManObj(p,v);
    if (pGVar2 == (Gia_Obj_t *)0x0) {
      return;
    }
    if ((-1 < (int)(uint)*(undefined8 *)pGVar2) ||
       (uVar1 = (uint)*(undefined8 *)pGVar2 & 0x1fffffff, uVar1 == 0x1fffffff)) {
      __assert_fail("Gia_ObjIsCo(pObj)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bmc/bmcBmcAnd.c"
                    ,0xa9,
                    "void Bmc_MnaCollect(Gia_Man_t *, Vec_Int_t *, Vec_Int_t *, unsigned int *)");
    }
    Bmc_MnaCollect_rec(p,pGVar2 + -(ulong)uVar1,vNodes,pState);
    uVar1 = pGVar2[-(ulong)((uint)*(undefined8 *)pGVar2 & 0x1fffffff)].Value;
    uVar3 = ((((uint)*(undefined8 *)pGVar2 >> 0x1d & 1) != 0) + 1 != uVar1) + 1;
    i = i + 1;
    if (uVar1 == 3) {
      uVar3 = 3;
    }
    pGVar2->Value = uVar3;
  } while (uVar1 == 3);
  __assert_fail("pObj->Value == GIA_UND",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bmc/bmcBmcAnd.c"
                ,0xac,"void Bmc_MnaCollect(Gia_Man_t *, Vec_Int_t *, Vec_Int_t *, unsigned int *)");
}

Assistant:

void Bmc_MnaCollect( Gia_Man_t * p, Vec_Int_t * vCos, Vec_Int_t * vNodes, unsigned * pState )
{
    Gia_Obj_t * pObj;
    int i;
    Vec_IntClear( vNodes );
    Gia_ManConst0(p)->fPhase = 1;
    Gia_ManConst0(p)->Value = GIA_ZER;
    Gia_ManForEachObjVec( vCos, p, pObj, i )
    {
        assert( Gia_ObjIsCo(pObj) );
        Bmc_MnaCollect_rec( p, Gia_ObjFanin0(pObj), vNodes, pState );
        pObj->Value = Gia_XsimNotCond( Gia_ObjFanin0(pObj)->Value, Gia_ObjFaninC0(pObj) );
        assert( pObj->Value == GIA_UND );
    }
}